

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignerInfo.c
# Opt level: O1

_Bool COSE_Signer_map_put_int(HCOSE_SIGNER h,int key,cn_cbor *value,int flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_SignerInfo *p;
  
  _Var1 = _COSE_IsInList(SignerRoot,(COSE *)h);
  if (_Var1) {
    if (value != (cn_cbor *)0x0) {
      _Var1 = _COSE_map_put((COSE *)h,key,value,flags,perr);
      return _Var1;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Signer_map_put_int(HCOSE_SIGNER h, int key, cn_cbor * value, int flags, cose_errback * perr)
{
	bool fRet = false;

	CHECK_CONDITION(IsValidSignerHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(value != NULL, COSE_ERR_INVALID_PARAMETER);

	return _COSE_map_put(&((COSE_SignerInfo *)h)->m_message, key, value, flags, perr);

errorReturn:
	return fRet;
}